

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

int cram_decode_aux(cram_container *c,cram_slice *s,cram_block *blk,cram_record *cr)

{
  undefined8 uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  cram_map *pcVar9;
  void *pvVar10;
  byte *pbVar11;
  byte *pbVar12;
  undefined1 auVar13 [16];
  double local_68;
  cram_map *m;
  uint uStack_50;
  uchar tag_data [3];
  int32_t out_sz_1;
  int32_t id;
  uint32_t ds;
  uchar *TN;
  int32_t TL;
  int out_sz;
  int r;
  int i;
  cram_record *cr_local;
  cram_block *blk_local;
  cram_slice *s_local;
  cram_container *c_local;
  
  TL = 0;
  TN._4_4_ = 1;
  TN._0_4_ = 0;
  uVar7 = c->comp_hdr->data_series;
  if ((uVar7 & 0x40004000) == 0) {
    cr->aux = 0;
    cr->aux_size = 0;
    c_local._4_4_ = 0;
  }
  else if (c->comp_hdr->codecs[0x20] == (cram_codec *)0x0) {
    c_local._4_4_ = -1;
  }
  else {
    _r = cr;
    cr_local = (cram_record *)blk;
    blk_local = (cram_block *)s;
    s_local = (cram_slice *)c;
    uVar6 = (*c->comp_hdr->codecs[0x20]->decode)
                      (s,c->comp_hdr->codecs[0x20],blk,(char *)&TN,(int *)((long)&TN + 4));
    TL = uVar6 | TL;
    if (((TL == 0) && (-1 < (int)TN)) && ((int)TN < s_local->features[5].field_0.X.base)) {
      _id = *(byte **)(*(long *)&s_local->features[6].field_0 + (long)(int)TN * 8);
      sVar8 = strlen((char *)_id);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar8;
      _r->ntags = SUB164(auVar5 / ZEXT816(3),0);
      _r->aux_size = 0;
      _r->aux = (int32_t)*(undefined8 *)(*(long *)&blk_local[2].content_type + 0x30);
      if ((uVar7 & 0x40000000) == 0) {
        c_local._4_4_ = 0;
      }
      else {
        for (out_sz = 0; out_sz < _r->ntags; out_sz = out_sz + 1) {
          m._4_4_ = 1;
          pbVar11 = _id + 1;
          bVar2 = *_id;
          pbVar12 = _id + 2;
          m._1_2_ = *(undefined2 *)_id;
          _id = _id + 3;
          m._3_1_ = *pbVar12;
          uStack_50 = (uint)bVar2 << 0x10 | (uint)*pbVar11 << 8 | (uint)m._3_1_;
          pcVar9 = map_find((cram_map **)(s_local->features + 0x18),(uchar *)((long)&m + 1),
                            uStack_50);
          if (pcVar9 == (cram_map *)0x0) {
            return -1;
          }
          while (*(ulong *)(*(long *)&blk_local[2].content_type + 0x28) <=
                 *(long *)(*(long *)&blk_local[2].content_type + 0x30) + 3U) {
            if (*(long *)(*(long *)&blk_local[2].content_type + 0x28) == 0) {
              local_68 = 1024.0;
            }
            else {
              uVar1 = *(undefined8 *)(*(long *)&blk_local[2].content_type + 0x28);
              auVar13._8_4_ = (int)((ulong)uVar1 >> 0x20);
              auVar13._0_8_ = uVar1;
              auVar13._12_4_ = 0x45300000;
              local_68 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
            }
            *(long *)(*(long *)&blk_local[2].content_type + 0x28) =
                 (long)local_68 | (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f;
            pvVar10 = realloc(*(void **)(*(long *)&blk_local[2].content_type + 0x20),
                              *(size_t *)(*(long *)&blk_local[2].content_type + 0x28));
            *(void **)(*(long *)&blk_local[2].content_type + 0x20) = pvVar10;
          }
          lVar3 = *(long *)(*(long *)&blk_local[2].content_type + 0x20);
          lVar4 = *(long *)(*(long *)&blk_local[2].content_type + 0x30);
          *(undefined2 *)(lVar3 + lVar4) = m._1_2_;
          *(byte *)(lVar3 + 2 + lVar4) = m._3_1_;
          *(long *)(*(long *)&blk_local[2].content_type + 0x30) =
               *(long *)(*(long *)&blk_local[2].content_type + 0x30) + 3;
          if (pcVar9->codec == (cram_codec *)0x0) {
            return -1;
          }
          uVar7 = (*pcVar9->codec->decode)
                            ((cram_slice *)blk_local,pcVar9->codec,(cram_block *)cr_local,
                             *(char **)&blk_local[2].content_type,(int *)((long)&m + 4));
          TL = uVar7 | TL;
          _r->aux_size = m._4_4_ + 3 + _r->aux_size;
        }
        c_local._4_4_ = TL;
      }
    }
    else {
      c_local._4_4_ = -1;
    }
  }
  return c_local._4_4_;
}

Assistant:

static int cram_decode_aux(cram_container *c, cram_slice *s,
			   cram_block *blk, cram_record *cr) {
    int i, r = 0, out_sz = 1;
    int32_t TL = 0;
    unsigned char *TN;
    uint32_t ds = c->comp_hdr->data_series;
	    
    if (!(ds & (CRAM_TL|CRAM_aux))) {
	cr->aux = 0;
	cr->aux_size = 0;
	return 0;
    }

    if (!c->comp_hdr->codecs[DS_TL]) return -1;
    r |= c->comp_hdr->codecs[DS_TL]->decode(s, c->comp_hdr->codecs[DS_TL], blk,
					    (char *)&TL, &out_sz);
    if (r || TL < 0 || TL >= c->comp_hdr->nTL)
	return -1;

    TN = c->comp_hdr->TL[TL];
    cr->ntags = strlen((char *)TN)/3; // optimise to remove strlen

    //printf("TC=%d\n", cr->ntags);
    cr->aux_size = 0;
    cr->aux = BLOCK_SIZE(s->aux_blk);

    if (!(ds & CRAM_aux))
	return 0;

    for (i = 0; i < cr->ntags; i++) {
	int32_t id, out_sz = 1;
	unsigned char tag_data[3];
	cram_map *m;

	//printf("Tag %d/%d\n", i+1, cr->ntags);
	tag_data[0] = *TN++;
	tag_data[1] = *TN++;
	tag_data[2] = *TN++;
	id = (tag_data[0]<<16) | (tag_data[1]<<8) | tag_data[2];

	m = map_find(c->comp_hdr->tag_encoding_map, tag_data, id);
	if (!m)
	    return -1;
	BLOCK_APPEND(s->aux_blk, (char *)tag_data, 3);

	if (!m->codec) return -1;
	r |= m->codec->decode(s, m->codec, blk, (char *)s->aux_blk, &out_sz);
	cr->aux_size += out_sz + 3;
    }
    
    return r;
}